

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_compress.hpp
# Opt level: O0

unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>
duckdb::PatasInitCompression<float>
          (ColumnDataCheckpointData *checkpoint_data,
          unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true> *state)

{
  InternalException *this;
  string *in_stack_ffffffffffffff98;
  allocator local_39;
  string local_38 [56];
  
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_38,"Patas has been deprecated, can no longer be used to compress data",&local_39)
  ;
  InternalException::InternalException(this,in_stack_ffffffffffffff98);
  __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

unique_ptr<CompressionState> PatasInitCompression(ColumnDataCheckpointData &checkpoint_data,
                                                  unique_ptr<AnalyzeState> state) {
	throw InternalException("Patas has been deprecated, can no longer be used to compress data");
	return nullptr;
}